

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnDemoRecord(RenX_LoggingPlugin *this,Server *server,string_view user)

{
  code *pcVar1;
  string msg;
  undefined8 local_48;
  long local_40;
  
  if ((*(uint *)&this->field_0xa8 >> 8 & 1) == 0) {
    pcVar1 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar1 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_48,&this->rconDemoRecordFmt);
  if (local_40 != 0) {
    RenX::processTags((string *)&local_48,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    RenX::replace_tag(&local_48,*(undefined8 *)(RenX::tags + 0x1750),
                      *(undefined8 *)(RenX::tags + 0x1748),user._M_len,user._M_str);
    (*pcVar1)(server,local_40,local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnDemoRecord(RenX::Server &server, std::string_view user)
{
	logFuncType func;
	if (RenX_LoggingPlugin::demoRecordPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->rconDemoRecordFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->nameTag, user);
		(server.*func)(msg);
	}
}